

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

MOJOSHADER_effect * MOJOSHADER_cloneEffect(MOJOSHADER_effect *effect)

{
  int iVar1;
  MOJOSHADER_symbolType MVar2;
  MOJOSHADER_malloc m;
  void *d;
  MOJOSHADER_effectPass *pMVar3;
  MOJOSHADER_effectState *pMVar4;
  long lVar5;
  MOJOSHADER_free p_Var6;
  MOJOSHADER_effect *_effect;
  MOJOSHADER_error *pMVar7;
  size_t sVar8;
  char *pcVar9;
  MOJOSHADER_effectParam *pMVar10;
  MOJOSHADER_effectAnnotation *pMVar11;
  MOJOSHADER_effectTechnique *pMVar12;
  MOJOSHADER_effectPass *pMVar13;
  MOJOSHADER_effectState *pMVar14;
  MOJOSHADER_effectObject *pMVar15;
  void *pvVar16;
  MOJOSHADER_preshader *pMVar17;
  MOJOSHADER_parseData *pMVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  
  if (effect != &MOJOSHADER_out_of_mem_effect && effect != (MOJOSHADER_effect *)0x0) {
    m = effect->malloc;
    d = effect->malloc_data;
    _effect = (MOJOSHADER_effect *)(*m)(0x78,d);
    if (_effect != (MOJOSHADER_effect *)0x0) {
      _effect->malloc = (MOJOSHADER_malloc)0x0;
      _effect->free = (MOJOSHADER_free)0x0;
      *(undefined8 *)&_effect->restore_shader_state = 0;
      _effect->state_changes = (MOJOSHADER_effectStateChanges *)0x0;
      _effect->current_pass = 0;
      _effect->object_count = 0;
      _effect->objects = (MOJOSHADER_effectObject *)0x0;
      _effect->techniques = (MOJOSHADER_effectTechnique *)0x0;
      _effect->current_technique = (MOJOSHADER_effectTechnique *)0x0;
      _effect->params = (MOJOSHADER_effectParam *)0x0;
      *(undefined8 *)&_effect->technique_count = 0;
      _effect->profile = (char *)0x0;
      *(undefined8 *)&_effect->param_count = 0;
      _effect->malloc_data = (void *)0x0;
      *(undefined8 *)_effect = 0;
      _effect->errors = (MOJOSHADER_error *)0x0;
      p_Var6 = effect->free;
      _effect->malloc = effect->malloc;
      _effect->free = p_Var6;
      _effect->malloc_data = effect->malloc_data;
      uVar22 = effect->error_count * 0x18;
      _effect->error_count = effect->error_count;
      pMVar7 = (MOJOSHADER_error *)(*m)(uVar22,d);
      _effect->errors = pMVar7;
      if (pMVar7 != (MOJOSHADER_error *)0x0) {
        lVar24 = 0;
        memset(pMVar7,0,(ulong)uVar22);
        for (lVar19 = 0; lVar19 < _effect->error_count; lVar19 = lVar19 + 1) {
          sVar8 = strlen(*(char **)((long)&effect->errors->error + lVar24));
          pcVar9 = (char *)(*m)((int)sVar8 + 1,d);
          if (pcVar9 == (char *)0x0) goto LAB_001239d8;
          strcpy(pcVar9,*(char **)((long)&effect->errors->error + lVar24));
          *(char **)((long)&_effect->errors->error + lVar24) = pcVar9;
          sVar8 = strlen(*(char **)((long)&effect->errors->filename + lVar24));
          pcVar9 = (char *)(*m)((int)sVar8 + 1,d);
          if (pcVar9 == (char *)0x0) goto LAB_001239d8;
          strcpy(pcVar9,*(char **)((long)&effect->errors->filename + lVar24));
          pMVar7 = _effect->errors;
          *(char **)((long)&pMVar7->filename + lVar24) = pcVar9;
          *(undefined4 *)((long)&pMVar7->error_position + lVar24) =
               *(undefined4 *)((long)&effect->errors->error_position + lVar24);
          lVar24 = lVar24 + 0x18;
        }
        sVar8 = strlen(effect->profile);
        pcVar9 = (char *)(*m)((int)sVar8 + 1,d);
        if (pcVar9 != (char *)0x0) {
          strcpy(pcVar9,effect->profile);
          _effect->profile = pcVar9;
          uVar22 = effect->param_count * 0x50;
          _effect->param_count = effect->param_count;
          pMVar10 = (MOJOSHADER_effectParam *)(*m)(uVar22,d);
          _effect->params = pMVar10;
          if (pMVar10 != (MOJOSHADER_effectParam *)0x0) {
            memset(pMVar10,0,(ulong)uVar22);
            for (lVar19 = 0; lVar19 < _effect->param_count; lVar19 = lVar19 + 1) {
              copyvalue(&_effect->params[lVar19].value,&effect->params[lVar19].value,m,d);
              uVar22 = effect->params[lVar19].annotation_count;
              _effect->params[lVar19].annotation_count = uVar22;
              uVar22 = uVar22 << 6;
              pMVar11 = (MOJOSHADER_effectAnnotation *)(*m)(uVar22,d);
              _effect->params[lVar19].annotations = pMVar11;
              if (pMVar11 == (MOJOSHADER_effectAnnotation *)0x0) goto LAB_001239d8;
              memset(pMVar11,0,(ulong)uVar22);
              lVar24 = 0;
              for (uVar25 = 0; uVar25 < _effect->params[lVar19].annotation_count;
                  uVar25 = uVar25 + 1) {
                copyvalue((MOJOSHADER_effectValue *)
                          ((long)&(_effect->params[lVar19].annotations)->name + lVar24),
                          (MOJOSHADER_effectValue *)
                          ((long)&(effect->params[lVar19].annotations)->name + lVar24),m,d);
                lVar24 = lVar24 + 0x40;
              }
            }
            uVar22 = effect->technique_count * 0x28;
            _effect->technique_count = effect->technique_count;
            pMVar12 = (MOJOSHADER_effectTechnique *)(*m)(uVar22,d);
            _effect->techniques = pMVar12;
            if (pMVar12 != (MOJOSHADER_effectTechnique *)0x0) {
              memset(pMVar12,0,(ulong)uVar22);
              for (lVar19 = 0; lVar19 < _effect->technique_count; lVar19 = lVar19 + 1) {
                sVar8 = strlen(effect->techniques[lVar19].name);
                pcVar9 = (char *)(*m)((int)sVar8 + 1,d);
                if (pcVar9 == (char *)0x0) goto LAB_001239d8;
                strcpy(pcVar9,effect->techniques[lVar19].name);
                pMVar12 = _effect->techniques;
                pMVar12[lVar19].name = pcVar9;
                uVar22 = effect->techniques[lVar19].pass_count;
                uVar23 = uVar22 * 0x28;
                pMVar12[lVar19].pass_count = uVar22;
                pMVar13 = (MOJOSHADER_effectPass *)(*m)(uVar23,d);
                _effect->techniques[lVar19].passes = pMVar13;
                if (pMVar13 == (MOJOSHADER_effectPass *)0x0) goto LAB_001239d8;
                memset(pMVar13,0,(ulong)uVar23);
                pMVar12 = _effect->techniques;
                for (uVar25 = 0; uVar25 < pMVar12[lVar19].pass_count; uVar25 = uVar25 + 1) {
                  sVar8 = strlen(effect->techniques[lVar19].passes[uVar25].name);
                  pcVar9 = (char *)(*m)((int)sVar8 + 1,d);
                  if (pcVar9 == (char *)0x0) goto LAB_001239d8;
                  strcpy(pcVar9,effect->techniques[lVar19].passes[uVar25].name);
                  pMVar13 = _effect->techniques[lVar19].passes;
                  pMVar13[uVar25].name = pcVar9;
                  uVar22 = effect->techniques[lVar19].passes[uVar25].state_count;
                  uVar23 = uVar22 * 0x48;
                  pMVar13[uVar25].state_count = uVar22;
                  pMVar14 = (MOJOSHADER_effectState *)(*m)(uVar23,d);
                  _effect->techniques[lVar19].passes[uVar25].states = pMVar14;
                  if (pMVar14 == (MOJOSHADER_effectState *)0x0) goto LAB_001239d8;
                  memset(pMVar14,0,(ulong)uVar23);
                  lVar24 = 8;
                  uVar27 = 0;
                  while( true ) {
                    pMVar13 = _effect->techniques[lVar19].passes;
                    pMVar3 = effect->techniques[lVar19].passes;
                    if (pMVar13[uVar25].state_count <= uVar27) break;
                    pMVar14 = pMVar3[uVar25].states;
                    pMVar4 = pMVar13[uVar25].states;
                    *(undefined4 *)((long)pMVar4 + lVar24 + -8) =
                         *(undefined4 *)((long)pMVar14 + lVar24 + -8);
                    copyvalue((MOJOSHADER_effectValue *)((long)&pMVar4->type + lVar24),
                              (MOJOSHADER_effectValue *)((long)&pMVar14->type + lVar24),m,d);
                    uVar27 = uVar27 + 1;
                    lVar24 = lVar24 + 0x48;
                  }
                  uVar22 = pMVar3[uVar25].annotation_count;
                  pMVar13[uVar25].annotation_count = uVar22;
                  uVar22 = uVar22 << 6;
                  pMVar11 = (MOJOSHADER_effectAnnotation *)(*m)(uVar22,d);
                  _effect->techniques[lVar19].passes[uVar25].annotations = pMVar11;
                  if (pMVar11 == (MOJOSHADER_effectAnnotation *)0x0) goto LAB_001239d8;
                  memset(pMVar11,0,(ulong)uVar22);
                  lVar24 = 0;
                  uVar27 = 0;
                  while( true ) {
                    pMVar12 = _effect->techniques;
                    if (pMVar12[lVar19].passes[uVar25].annotation_count <= uVar27) break;
                    copyvalue((MOJOSHADER_effectValue *)
                              ((long)&(pMVar12[lVar19].passes[uVar25].annotations)->name + lVar24),
                              (MOJOSHADER_effectValue *)
                              ((long)&(effect->techniques[lVar19].passes[uVar25].annotations)->name
                              + lVar24),m,d);
                    uVar27 = uVar27 + 1;
                    lVar24 = lVar24 + 0x40;
                  }
                }
                uVar22 = effect->techniques[lVar19].annotation_count;
                pMVar12[lVar19].annotation_count = uVar22;
                uVar22 = uVar22 << 6;
                pMVar11 = (MOJOSHADER_effectAnnotation *)(*m)(uVar22,d);
                _effect->techniques[lVar19].annotations = pMVar11;
                if (pMVar11 == (MOJOSHADER_effectAnnotation *)0x0) goto LAB_001239d8;
                memset(pMVar11,0,(ulong)uVar22);
                lVar24 = 0;
                for (uVar25 = 0; uVar25 < _effect->techniques[lVar19].annotation_count;
                    uVar25 = uVar25 + 1) {
                  copyvalue((MOJOSHADER_effectValue *)
                            ((long)&(_effect->techniques[lVar19].annotations)->name + lVar24),
                            (MOJOSHADER_effectValue *)
                            ((long)&(effect->techniques[lVar19].annotations)->name + lVar24),m,d);
                  lVar24 = lVar24 + 0x40;
                }
              }
              uVar25 = 0;
              if (0 < effect->technique_count) {
                uVar25 = (ulong)(uint)effect->technique_count;
              }
              lVar19 = -0x28;
              do {
                lVar24 = lVar19;
                if (uVar25 * 0x28 - (lVar24 + 0x28) == 0) {
                  pMVar12 = _effect->current_technique;
                  goto LAB_00123739;
                }
                lVar19 = lVar24 + 0x28;
              } while ((MOJOSHADER_effectTechnique *)((long)&effect->techniques[1].name + lVar24) !=
                       effect->current_technique);
              pMVar12 = (MOJOSHADER_effectTechnique *)((long)&_effect->techniques[1].name + lVar24);
              _effect->current_technique = pMVar12;
LAB_00123739:
              if (pMVar12 == (MOJOSHADER_effectTechnique *)0x0) {
                __assert_fail("clone->current_technique != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                              ,0x626,
                              "MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *)"
                             );
              }
              iVar1 = effect->current_pass;
              _effect->current_pass = iVar1;
              if (iVar1 != -1) {
                __assert_fail("clone->current_pass == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                              ,0x628,
                              "MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *)"
                             );
              }
              uVar22 = effect->object_count * 0x48;
              _effect->object_count = effect->object_count;
              pMVar15 = (MOJOSHADER_effectObject *)(*m)(uVar22,d);
              _effect->objects = pMVar15;
              if (pMVar15 != (MOJOSHADER_effectObject *)0x0) {
                lVar19 = 0;
                memset(pMVar15,0,(ulong)uVar22);
                do {
                  if (_effect->object_count <= lVar19) {
                    return _effect;
                  }
                  lVar24 = lVar19 * 0x48;
                  _effect->objects[lVar19].type = effect->objects[lVar19].type;
                  MVar2 = _effect->objects[lVar19].type;
                  if (MVar2 - MOJOSHADER_SYMTYPE_SAMPLER < 5) {
LAB_001237ae:
                    sVar8 = strlen(*(char **)((long)effect->objects + lVar24 + 8));
                    pcVar9 = (char *)(*m)((int)sVar8 + 1,d);
                    if (pcVar9 == (char *)0x0) break;
                    strcpy(pcVar9,*(char **)((long)effect->objects + lVar24 + 8));
                    *(char **)((long)_effect->objects + lVar24 + 8) = pcVar9;
                  }
                  else if (MVar2 - MOJOSHADER_SYMTYPE_PIXELSHADER < 2) {
                    *(undefined4 *)((long)_effect->objects + lVar24 + 4) =
                         *(undefined4 *)((long)effect->objects + lVar24 + 4);
                    *(undefined4 *)((long)_effect->objects + lVar24 + 8) =
                         *(undefined4 *)((long)effect->objects + lVar24 + 8);
                    *(undefined4 *)((long)_effect->objects + lVar24 + 0xc) =
                         *(undefined4 *)((long)effect->objects + lVar24 + 0xc);
                    iVar1 = *(int *)((long)effect->objects + lVar24 + 0x10);
                    *(int *)((long)_effect->objects + lVar24 + 0x10) = iVar1;
                    uVar22 = iVar1 << 2;
                    pvVar16 = (*m)(uVar22,d);
                    *(void **)((long)_effect->objects + lVar24 + 0x18) = pvVar16;
                    memcpy(*(void **)((long)_effect->objects + lVar24 + 0x18),
                           *(void **)((long)effect->objects + lVar24 + 0x18),(ulong)uVar22);
                    iVar1 = *(int *)((long)effect->objects + lVar24 + 0x20);
                    *(int *)((long)_effect->objects + lVar24 + 0x20) = iVar1;
                    uVar22 = iVar1 << 2;
                    pvVar16 = (*m)(uVar22,d);
                    *(void **)((long)_effect->objects + lVar24 + 0x28) = pvVar16;
                    memcpy(*(void **)((long)_effect->objects + lVar24 + 0x28),
                           *(void **)((long)effect->objects + lVar24 + 0x28),(ulong)uVar22);
                    pMVar18 = *(MOJOSHADER_parseData **)((long)effect->objects + lVar24 + 0x40);
                    if (*(int *)((long)_effect->objects + lVar24 + 0xc) == 0) {
                      pMVar18 = copyparsedata(pMVar18,m,d);
                      *(MOJOSHADER_parseData **)((long)_effect->objects + lVar24 + 0x40) = pMVar18;
                      iVar1 = *(int *)((long)effect->objects + lVar24 + 0x30);
                      *(int *)((long)_effect->objects + lVar24 + 0x30) = iVar1;
                      pvVar16 = (*m)(iVar1 * 0x18,d);
                      *(void **)((long)_effect->objects + lVar24 + 0x38) = pvVar16;
                      pMVar15 = _effect->objects;
                      if (*(long *)((long)pMVar15 + lVar24 + 0x38) == 0) break;
                      lVar20 = 0;
                      uVar22 = 0;
                      for (lVar21 = 0; lVar5 = *(long *)((long)pMVar15 + lVar24 + 0x40),
                          lVar21 < *(int *)(lVar5 + 0xa0); lVar21 = lVar21 + 1) {
                        lVar5 = *(long *)(lVar5 + 0xa8);
                        if (*(int *)(lVar5 + 8 + lVar20) == 3) {
                          lVar26 = (ulong)uVar22 * 0x18;
                          *(undefined8 *)(*(long *)((long)pMVar15 + lVar24 + 0x38) + lVar26) =
                               *(undefined8 *)(lVar5 + lVar20);
                          *(undefined4 *)(*(long *)((long)pMVar15 + lVar24 + 0x38) + 8 + lVar26) =
                               *(undefined4 *)
                                (*(long *)(*(long *)((long)pMVar15 + lVar24 + 0x40) + 0xa8) + 0xc +
                                lVar20);
                          pMVar10 = _effect->params;
                          *(uint *)(*(long *)((long)pMVar15 + lVar24 + 0x38) + 0xc + lVar26) =
                               pMVar10[*(uint *)(*(long *)((long)pMVar15 + lVar24 + 0x28) +
                                                lVar21 * 4)].value.value_count;
                          *(anon_union_8_20_d40dc30a_for_MOJOSHADER_effectValue_4 *)
                           (*(long *)((long)pMVar15 + lVar24 + 0x38) + 0x10 + lVar26) =
                               pMVar10[*(uint *)(*(long *)((long)pMVar15 + lVar24 + 0x28) +
                                                lVar21 * 4)].value.field_4;
                          uVar22 = uVar22 + 1;
                        }
                        lVar20 = lVar20 + 0x38;
                      }
                    }
                    else {
                      pMVar17 = copypreshader((MOJOSHADER_preshader *)pMVar18,m,d);
                      *(MOJOSHADER_preshader **)((long)_effect->objects + lVar24 + 0x40) = pMVar17;
                    }
                  }
                  else if (MVar2 == MOJOSHADER_SYMTYPE_STRING) goto LAB_001237ae;
                  lVar19 = lVar19 + 1;
                } while( true );
              }
            }
          }
        }
      }
LAB_001239d8:
      MOJOSHADER_freeEffect(_effect);
    }
  }
  return (MOJOSHADER_effect *)0x0;
}

Assistant:

MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *effect)
{
    int i, j, k;
    MOJOSHADER_effect *clone;
    MOJOSHADER_malloc m = effect->malloc;
    void *d = effect->malloc_data;
    uint32 siz = 0;
    char *stringcopy = NULL;
    uint32 curSampler;

    if ((effect == NULL) || (effect == &MOJOSHADER_out_of_mem_effect))
        return NULL;  // no-op.

    clone = (MOJOSHADER_effect *) m(sizeof (MOJOSHADER_effect), d);
    if (clone == NULL)
        return NULL; // Maybe out_of_mem_effect instead?
    memset(clone, '\0', sizeof (MOJOSHADER_effect));

    /* Copy malloc/free */
    clone->malloc = effect->malloc;
    clone->free = effect->free;
    clone->malloc_data = effect->malloc_data;

    #define COPY_STRING(location) \
        siz = strlen(effect->location) + 1; \
        stringcopy = (char *) m(siz, d); \
        if (stringcopy == NULL) \
            goto cloneEffect_outOfMemory; \
        strcpy(stringcopy, effect->location); \
        clone->location = stringcopy; \

    /* Copy errors */
    siz = sizeof (MOJOSHADER_error) * effect->error_count;
    clone->error_count = effect->error_count;
    clone->errors = (MOJOSHADER_error *) m(siz, d);
    if (clone->errors == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->errors, '\0', siz);
    for (i = 0; i < clone->error_count; i++)
    {
        COPY_STRING(errors[i].error)
        COPY_STRING(errors[i].filename)
        clone->errors[i].error_position = effect->errors[i].error_position;
    } // for

    /* Copy profile string */
    COPY_STRING(profile)

    /* Copy parameters */
    siz = sizeof (MOJOSHADER_effectParam) * effect->param_count;
    clone->param_count = effect->param_count;
    clone->params = (MOJOSHADER_effectParam *) m(siz, d);
    if (clone->params == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->params, '\0', siz);
    for (i = 0; i < clone->param_count; i++)
    {
        copyvalue(&clone->params[i].value, &effect->params[i].value, m, d);

        /* Copy parameter annotations */
        siz = sizeof (MOJOSHADER_effectAnnotation) * effect->params[i].annotation_count;
        clone->params[i].annotation_count = effect->params[i].annotation_count;
        clone->params[i].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
        if (clone->params[i].annotations == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->params[i].annotations, '\0', siz);
        for (j = 0; j < clone->params[i].annotation_count; j++)
            copyvalue(&clone->params[i].annotations[j],
                      &effect->params[i].annotations[j],
                      m, d);
    } // for

    /* Copy techniques */
    siz = sizeof (MOJOSHADER_effectTechnique) * effect->technique_count;
    clone->technique_count = effect->technique_count;
    clone->techniques = (MOJOSHADER_effectTechnique *) m(siz, d);
    if (clone->techniques == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->techniques, '\0', siz);
    for (i = 0; i < clone->technique_count; i++)
    {
        COPY_STRING(techniques[i].name)

        /* Copy passes */
        siz = sizeof (MOJOSHADER_effectPass) * effect->techniques[i].pass_count;
        clone->techniques[i].pass_count = effect->techniques[i].pass_count;
        clone->techniques[i].passes = (MOJOSHADER_effectPass *) m(siz, d);
        if (clone->techniques[i].passes == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->techniques[i].passes, '\0', siz);
        for (j = 0; j < clone->techniques[i].pass_count; j++)
        {
            COPY_STRING(techniques[i].passes[j].name)

            /* Copy pass states */
            siz = sizeof (MOJOSHADER_effectState) * effect->techniques[i].passes[j].state_count;
            clone->techniques[i].passes[j].state_count = effect->techniques[i].passes[j].state_count;
            clone->techniques[i].passes[j].states = (MOJOSHADER_effectState *) m(siz, d);
            if (clone->techniques[i].passes[j].states == NULL)
                goto cloneEffect_outOfMemory;
            memset(clone->techniques[i].passes[j].states, '\0', siz);
            for (k = 0; k < clone->techniques[i].passes[j].state_count; k++)
            {
                clone->techniques[i].passes[j].states[k].type = effect->techniques[i].passes[j].states[k].type;
                copyvalue(&clone->techniques[i].passes[j].states[k].value,
                          &effect->techniques[i].passes[j].states[k].value,
                          m, d);
            } // for

            /* Copy pass annotations */
            siz = sizeof (MOJOSHADER_effectAnnotation) * effect->techniques[i].passes[j].annotation_count;
            clone->techniques[i].passes[j].annotation_count = effect->techniques[i].passes[j].annotation_count;
            clone->techniques[i].passes[j].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
            if (clone->techniques[i].passes[j].annotations == NULL)
                goto cloneEffect_outOfMemory;
            memset(clone->techniques[i].passes[j].annotations, '\0', siz);
            for (k = 0; k < clone->techniques[i].passes[j].annotation_count; k++)
                copyvalue(&clone->techniques[i].passes[j].annotations[k],
                          &effect->techniques[i].passes[j].annotations[k],
                          m, d);
        } // for

        /* Copy technique annotations */
        siz = sizeof (MOJOSHADER_effectAnnotation) * effect->techniques[i].annotation_count;
        clone->techniques[i].annotation_count = effect->techniques[i].annotation_count;
        clone->techniques[i].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
        if (clone->techniques[i].annotations == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->techniques[i].annotations, '\0', siz);
        for (j = 0; j < clone->techniques[i].annotation_count; j++)
            copyvalue(&clone->techniques[i].annotations[j],
                      &effect->techniques[i].annotations[j],
                      m, d);
    } // for

    /* Copy the current technique/pass */
    for (i = 0; i < effect->technique_count; i++)
        if (&effect->techniques[i] == effect->current_technique)
        {
            clone->current_technique = &clone->techniques[i];
            break;
        } // if
    assert(clone->current_technique != NULL);
    clone->current_pass = effect->current_pass;
    assert(clone->current_pass == -1);

    /* Copy object table */
    siz = sizeof (MOJOSHADER_effectObject) * effect->object_count;
    clone->object_count = effect->object_count;
    clone->objects = (MOJOSHADER_effectObject *) m(siz, d);
    if (clone->objects == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->objects, '\0', siz);
    for (i = 0; i < clone->object_count; i++)
    {
        clone->objects[i].type = effect->objects[i].type;
        if (clone->objects[i].type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || clone->objects[i].type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            clone->objects[i].shader.technique = effect->objects[i].shader.technique;
            clone->objects[i].shader.pass = effect->objects[i].shader.pass;
            clone->objects[i].shader.is_preshader = effect->objects[i].shader.is_preshader;
            siz = sizeof (uint32) * effect->objects[i].shader.preshader_param_count;
            clone->objects[i].shader.preshader_param_count = effect->objects[i].shader.preshader_param_count;
            clone->objects[i].shader.preshader_params = (uint32 *) m(siz, d);
            memcpy(clone->objects[i].shader.preshader_params,
                   effect->objects[i].shader.preshader_params,
                   siz);
            siz = sizeof (uint32) * effect->objects[i].shader.param_count;
            clone->objects[i].shader.param_count = effect->objects[i].shader.param_count;
            clone->objects[i].shader.params = (uint32 *) m(siz, d);
            memcpy(clone->objects[i].shader.params,
                   effect->objects[i].shader.params,
                   siz);

            if (clone->objects[i].shader.is_preshader)
            {
                clone->objects[i].shader.preshader = copypreshader(effect->objects[i].shader.preshader,
                                                                   m, d);
                continue;
            } // if

            clone->objects[i].shader.shader = copyparsedata(effect->objects[i].shader.shader,
                                                            m, d);

            siz = sizeof (MOJOSHADER_samplerStateRegister) * effect->objects[i].shader.sampler_count;
            clone->objects[i].shader.sampler_count = effect->objects[i].shader.sampler_count;
            clone->objects[i].shader.samplers = (MOJOSHADER_samplerStateRegister *) m(siz, d);
            if (clone->objects[i].shader.samplers == NULL)
                goto cloneEffect_outOfMemory;
            curSampler = 0;
            for (j = 0; j < clone->objects[i].shader.shader->symbol_count; j++)
                if (clone->objects[i].shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                {
                    clone->objects[i].shader.samplers[curSampler].sampler_name = clone->objects[i].shader.shader->symbols[j].name;
                    clone->objects[i].shader.samplers[curSampler].sampler_register = clone->objects[i].shader.shader->symbols[j].register_index;
                    clone->objects[i].shader.samplers[curSampler].sampler_state_count = clone->params[clone->objects[i].shader.params[j]].value.value_count;
                    clone->objects[i].shader.samplers[curSampler].sampler_states = clone->params[clone->objects[i].shader.params[j]].value.valuesSS;
                    curSampler++;
                } // if
        } // if
        else if (clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            COPY_STRING(objects[i].mapping.name)
        } // else if
        else if (clone->objects[i].type == MOJOSHADER_SYMTYPE_STRING)
        {
            COPY_STRING(objects[i].string.string)
        } // else if
    } // for

    #undef COPY_STRING

    return clone;

cloneEffect_outOfMemory:
    MOJOSHADER_freeEffect(clone);
    return NULL;
}